

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelExtractor_impl.hpp
# Opt level: O0

void __thiscall
hiberlite::ExtractModel::
act<hiberlite::AVisitor<hiberlite::ExtractModel>,std::vector<int,std::allocator<int>>,hiberlite::stl_stream_adapter<std::vector<int,std::allocator<int>>,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>
          (ExtractModel *this,AVisitor<hiberlite::ExtractModel> *av,
          collection_nvp<std::vector<int,_std::allocator<int>_>,_hiberlite::stl_stream_adapter<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
          *nvp)

{
  vector<int,_std::allocator<int>_> *_value;
  collection_nvp<std::vector<int,_std::allocator<int>_>,_hiberlite::stl_stream_adapter<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  *pcVar1;
  sql_nvp<std::vector<int,_std::allocator<int>_>_> local_2a8;
  allocator local_259;
  string local_258 [39];
  allocator local_231;
  string local_230 [32];
  undefined1 local_210 [8];
  sql_nvp<std::vector<int,_std::allocator<int>_>_> el;
  string local_1c0 [39];
  allocator local_199;
  string local_198 [32];
  Scope local_178;
  undefined1 local_130 [40];
  string local_108 [39];
  allocator local_e1;
  string local_e0 [32];
  Scope local_c0;
  undefined1 local_78 [80];
  vector<int,_std::allocator<int>_> *local_28;
  vector<int,_std::allocator<int>_> *entry;
  collection_nvp<std::vector<int,_std::allocator<int>_>,_hiberlite::stl_stream_adapter<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  *nvp_local;
  AVisitor<hiberlite::ExtractModel> *av_local;
  ExtractModel *this_local;
  
  entry = (vector<int,_std::allocator<int>_> *)nvp;
  nvp_local = (collection_nvp<std::vector<int,_std::allocator<int>_>,_hiberlite::stl_stream_adapter<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
               *)av;
  av_local = (AVisitor<hiberlite::ExtractModel> *)this;
  construct<hiberlite::AVisitor<hiberlite::ExtractModel>,std::vector<int,std::allocator<int>>>
            (av,&local_28,0);
  pcVar1 = nvp_local;
  std::__cxx11::string::string((string *)(local_78 + 0x30),(string *)nvp);
  AVisitor<hiberlite::ExtractModel>::diveTable
            ((AVisitor<hiberlite::ExtractModel> *)pcVar1,(string *)(local_78 + 0x30));
  std::__cxx11::string::~string((string *)(local_78 + 0x30));
  AVisitor<hiberlite::ExtractModel>::getScope
            (&local_c0,(AVisitor<hiberlite::ExtractModel> *)nvp_local);
  Scope::table_abi_cxx11_((Scope *)local_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"hiberlite_parent_id",&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"INTEGER",(allocator *)(local_130 + 0x27));
  putNamedColumn(this,(string *)local_78,(string *)local_e0,(string *)local_108);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)(local_130 + 0x27));
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::__cxx11::string::~string((string *)local_78);
  Scope::~Scope(&local_c0);
  AVisitor<hiberlite::ExtractModel>::getScope
            (&local_178,(AVisitor<hiberlite::ExtractModel> *)nvp_local);
  Scope::table_abi_cxx11_((Scope *)local_130);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,"hiberlite_entry_indx",&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c0,"INTEGER",(allocator *)&el.field_0x47);
  putNamedColumn(this,(string *)local_130,(string *)local_198,(string *)local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&el.field_0x47);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  std::__cxx11::string::~string((string *)local_130);
  Scope::~Scope(&local_178);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_230,"item",&local_231);
  _value = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"",&local_259);
  sql_nvp<std::vector<int,_std::allocator<int>_>_>::sql_nvp
            ((sql_nvp<std::vector<int,_std::allocator<int>_>_> *)local_210,(string *)local_230,
             _value,(string *)local_258);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  pcVar1 = nvp_local;
  sql_nvp<std::vector<int,_std::allocator<int>_>_>::sql_nvp
            (&local_2a8,(sql_nvp<std::vector<int,_std::allocator<int>_>_> *)local_210);
  AVisitor<hiberlite::ExtractModel>::operator&
            ((AVisitor<hiberlite::ExtractModel> *)pcVar1,&local_2a8);
  sql_nvp<std::vector<int,_std::allocator<int>_>_>::~sql_nvp(&local_2a8);
  AVisitor<hiberlite::ExtractModel>::pop((AVisitor<hiberlite::ExtractModel> *)nvp_local);
  destroy<hiberlite::ExtractModel,std::vector<int,std::allocator<int>>>(this,local_28,0);
  sql_nvp<std::vector<int,_std::allocator<int>_>_>::~sql_nvp
            ((sql_nvp<std::vector<int,_std::allocator<int>_>_> *)local_210);
  return;
}

Assistant:

void ExtractModel::act(AV& av, collection_nvp<E,S> nvp )
{
	E* entry;
	construct(av, &entry, static_cast<unsigned int>(0));
		av.diveTable(nvp.name);

			putNamedColumn(av.getScope().table(), HIBERLITE_PARENTID_COLUMN, HIBERLITE_ID_STORAGE_CLASS);
			putNamedColumn(av.getScope().table(), HIBERLITE_ENTRY_INDEX_COLUMN, HIBERLITE_ID_STORAGE_CLASS);

			sql_nvp<E> el("item",*entry);
			av & el;
		av.pop();
	destroy(*this, entry, static_cast<unsigned int>(0));
}